

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_posix.c
# Opt level: O3

void tree_push(tree *t,char *path,wchar_t filesystem_id,int64_t dev,int64_t ino,restore_time *rt)

{
  tree_entry *ptVar1;
  long lVar2;
  int iVar3;
  tree_entry *ptVar4;
  size_t n;
  
  ptVar4 = (tree_entry *)calloc(1,0x88);
  ptVar4->next = t->stack;
  ptVar1 = t->current;
  ptVar4->parent = ptVar1;
  if (ptVar1 != (tree_entry *)0x0) {
    ptVar4->depth = ptVar1->depth + 1;
  }
  t->stack = ptVar4;
  (ptVar4->name).s = (char *)0x0;
  (ptVar4->name).length = 0;
  (ptVar4->name).buffer_length = 0;
  ptVar4->symlink_parent_fd = -1;
  if (path == (char *)0x0) {
    n = 0;
  }
  else {
    n = strlen(path);
  }
  archive_strncat(&ptVar4->name,path,n);
  ptVar4->flags = 0x38;
  ptVar4->filesystem_id = filesystem_id;
  ptVar4->dev = dev;
  ptVar4->ino = ino;
  ptVar4->dirname_length = t->dirname_length;
  (ptVar4->restore_time).name = (ptVar4->name).s;
  if (rt != (restore_time *)0x0) {
    lVar2 = rt->mtime_nsec;
    (ptVar4->restore_time).mtime = rt->mtime;
    (ptVar4->restore_time).mtime_nsec = lVar2;
    lVar2 = rt->atime_nsec;
    (ptVar4->restore_time).atime = rt->atime;
    (ptVar4->restore_time).atime_nsec = lVar2;
    iVar3 = rt->noatime;
    (ptVar4->restore_time).filetype = rt->filetype;
    (ptVar4->restore_time).noatime = iVar3;
  }
  return;
}

Assistant:

static void
tree_push(struct tree *t, const char *path, int filesystem_id,
    int64_t dev, int64_t ino, struct restore_time *rt)
{
	struct tree_entry *te;

	te = malloc(sizeof(*te));
	memset(te, 0, sizeof(*te));
	te->next = t->stack;
	te->parent = t->current;
	if (te->parent)
		te->depth = te->parent->depth + 1;
	t->stack = te;
	archive_string_init(&te->name);
	te->symlink_parent_fd = -1;
	archive_strcpy(&te->name, path);
	te->flags = needsDescent | needsOpen | needsAscent;
	te->filesystem_id = filesystem_id;
	te->dev = dev;
	te->ino = ino;
	te->dirname_length = t->dirname_length;
	te->restore_time.name = te->name.s;
	if (rt != NULL) {
		te->restore_time.mtime = rt->mtime;
		te->restore_time.mtime_nsec = rt->mtime_nsec;
		te->restore_time.atime = rt->atime;
		te->restore_time.atime_nsec = rt->atime_nsec;
		te->restore_time.filetype = rt->filetype;
		te->restore_time.noatime = rt->noatime;
	}
}